

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxcover.cpp
# Opt level: O3

size_t sets_union<512ul,std::array<unsigned_long,5ul>>
                 (vector<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_> *binary_sets,
                 array<unsigned_long,_5UL> *c)

{
  pointer pbVar1;
  long lVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [64];
  undefined1 auVar6 [16];
  
  pbVar1 = (binary_sets->
           super__Vector_base<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  auVar5 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                              pbVar1[c->_M_elems[0]].super__Base_bitset<8UL>._M_w);
  lVar3 = 0;
  do {
    lVar2 = lVar3 + 1;
    lVar3 = lVar3 + 1;
    auVar5 = vporq_avx512f(auVar5,*(undefined1 (*) [64])
                                   pbVar1[c->_M_elems[lVar2]].super__Base_bitset<8UL>._M_w);
  } while (lVar3 != 4);
  auVar5 = vpopcntq_avx512_vpopcntdq(auVar5);
  auVar4 = vpmovqb_avx512f(auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = auVar4._0_8_;
  auVar4 = vpsadbw_avx(auVar6,(undefined1  [16])0x0);
  return auVar4._0_8_;
}

Assistant:

size_t sets_union(const std::vector<std::bitset<n_entities>>& binary_sets, const Collection& c)
{
    auto x = binary_sets[c[0]];
    for (size_t i = 1; i < c.size(); ++i)
        x |= binary_sets[c[i]];
    return x.count();
}